

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O2

void __thiscall
cfdcapi_transaction_SignTransactionTest_Test::TestBody
          (cfdcapi_transaction_SignTransactionTest_Test *this)

{
  bool bVar1;
  undefined8 address;
  AssertHelper AVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  void **create_handle_00;
  int local_a4;
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  void *handle;
  void *create_handle;
  int tmp_ret;
  char *sig;
  char *sighash;
  char *tmp_sig;
  
  handle = (void *)0x0;
  local_a4 = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x68,pcVar6);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&create_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&create_handle,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&create_handle);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_90.data_ = (AssertHelperData *)0x0;
  do {
    if ((AssertHelperData *)0x6 < local_90.data_) {
      local_a4 = CfdFreeHandle(handle);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x192,pcVar6);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    create_handle = (void *)0x0;
    sighash = (char *)0x0;
    sig = (char *)0x0;
    tmp_sig = (char *)0x0;
    create_handle_00 = &create_handle;
    local_a4 = CfdInitializeTransaction(handle,2,2,0,(char *)0x0,create_handle_00);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar6 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf1,pcVar6);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = create_handle != (void *)0x0;
    if (create_handle == (void *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"(NULL == create_handle)","true","false",
                 (char *)create_handle_00);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tmp_ret,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0xf2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&tmp_ret,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmp_ret);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (local_a4 == 0) {
      local_a4 = CfdSetTransactionUtxoData
                           (handle,create_handle,
                            (&PTR_anon_var_dwarf_cb792_0078dab8)[(long)local_90.data_ * 0x11],0,
                            *(int64_t *)(&DAT_0078dad0 + (long)local_90.data_ * 0x88),(char *)0x0,
                            (&PTR_anon_var_dwarf_2cbaac_0078dac8)[(long)local_90.data_ * 0x11],
                            (char *)0x0,(char *)0x0,(char *)0x0,true);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar6 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xf7,pcVar6);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_a4 = CfdAddTransactionOutput
                           (handle,create_handle,
                            *(int64_t *)(&DAT_0078db20 + (long)local_90.data_ * 0x88),
                            (&PTR_anon_var_dwarf_1ecdba_0078db18)[(long)local_90.data_ * 0x11],
                            (char *)0x0,(char *)0x0);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar6 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0xfb,pcVar6);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      if (local_a4 == 0) {
        lVar5 = (long)local_90.data_ * 0x88;
        if ((&DAT_0078db30)[lVar5] == '\x01') {
          local_a4 = CfdAddSignWithPrivkeyByHandle
                               (handle,create_handle,
                                (&PTR_anon_var_dwarf_cb792_0078dab8)[(long)local_90.data_ * 0x11],0,
                                (&PTR_anon_var_dwarf_2cbade_0078db08)[(long)local_90.data_ * 0x11],1
                                ,false,true,*(char **)(&DAT_0078daf8 + lVar5),(char *)0x0);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4)
          ;
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            pcVar6 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x105,pcVar6);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          bVar1 = false;
        }
        else {
          if (*(char **)(&DAT_0078dad8 + lVar5) == (char *)0x0) {
            pcVar6 = (&PTR_anon_var_dwarf_2cbac5_0078db00)[(long)local_90.data_ * 0x11];
          }
          else {
            pcVar6 = (char *)0x0;
          }
          local_a4 = CfdCreateSighashByHandle
                               (handle,create_handle,
                                (&PTR_anon_var_dwarf_cb792_0078dab8)[(long)local_90.data_ * 0x11],0,
                                1,false,pcVar6,*(char **)(&DAT_0078dad8 + lVar5),
                                *(char **)(&DAT_0078dae8 + lVar5),0xffffffff,(char *)0x0,&sighash);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&local_a4)
          ;
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            pcVar6 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x10f,pcVar6);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          AVar2.data_ = local_90.data_;
          if (local_a4 == 0) {
            lVar5 = (long)local_90.data_ * 0x88;
            sVar4 = strlen((&PTR_anon_var_dwarf_2cbac5_0078db00)[(long)local_90.data_ * 0x11]);
            if (sVar4 != 0x40) {
              local_a4 = CfdCalculateEcSignature
                                   (handle,sighash,
                                    (&PTR_anon_var_dwarf_2cbade_0078db08)[(long)AVar2.data_ * 0x11],
                                    (char *)0x0,2,true,&sig);
              if (*(long *)(&DAT_0078dad8 + lVar5) == 0) {
                gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x14a,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_a4 = CfdAddPubkeyHashSignByHandle
                                     (handle,create_handle,
                                      (&PTR_anon_var_dwarf_cb792_0078dab8)
                                      [(long)local_90.data_ * 0x11],0,
                                      *(int *)(&DAT_0078db34 + (long)local_90.data_ * 0x88),
                                      (&PTR_anon_var_dwarf_2cbac5_0078db00)
                                      [(long)local_90.data_ * 0x11],sig,true,1,false);
                gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x150,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
              }
              else {
                gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x133,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_a4 = CfdAddTxSignByHandle
                                     (handle,create_handle,
                                      (&PTR_anon_var_dwarf_cb792_0078dab8)
                                      [(long)local_90.data_ * 0x11],0,
                                      *(int *)(&DAT_0078db34 + (long)local_90.data_ * 0x88),"",false
                                      ,1,false,true);
                gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x13a,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_a4 = CfdAddTxSignByHandle
                                     (handle,create_handle,
                                      (&PTR_anon_var_dwarf_cb792_0078dab8)
                                      [(long)local_90.data_ * 0x11],0,
                                      *(int *)(&DAT_0078db34 + (long)local_90.data_ * 0x88),sig,true
                                      ,1,false,false);
                gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x140,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_a4 = CfdAddScriptHashLastSignByHandle
                                     (handle,create_handle,
                                      (&PTR_anon_var_dwarf_cb792_0078dab8)
                                      [(long)local_90.data_ * 0x11],0,
                                      *(int *)(&DAT_0078db34 + (long)local_90.data_ * 0x88),
                                      *(char **)(&DAT_0078dad8 + (long)local_90.data_ * 0x88));
                gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                           &local_a4);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x145,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
              }
LAB_0029d96e:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              goto LAB_0029d978;
            }
            local_a4 = CfdSignSchnorr(handle,sighash,
                                      (&PTR_anon_var_dwarf_2cbade_0078db08)
                                      [(long)AVar2.data_ * 0x11],*(char **)(&DAT_0078daf8 + lVar5),
                                      &tmp_sig);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                       &local_a4);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar6 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x116,pcVar6);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_a4 = CfdAddSighashTypeInSchnorrSignature(handle,tmp_sig,1,false,&sig);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                       &local_a4);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar6 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x119,pcVar6);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            if (*(long *)(&DAT_0078dad8 + (long)local_90.data_ * 0x88) == 0) {
              local_a4 = CfdAddTaprootSignByHandle
                                   (handle,create_handle,
                                    (&PTR_anon_var_dwarf_cb792_0078dab8)
                                    [(long)local_90.data_ * 0x11],0,sig,(char *)0x0,(char *)0x0,
                                    (char *)0x0);
              gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                         &local_a4);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar6 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,300,pcVar6);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              goto LAB_0029d96e;
            }
            local_a4 = CfdAddTxSignByHandle
                                 (handle,create_handle,
                                  (&PTR_anon_var_dwarf_cb792_0078dab8)[(long)local_90.data_ * 0x11],
                                  0,*(int *)(&DAT_0078db34 + (long)local_90.data_ * 0x88),sig,false,
                                  1,false,true);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                       &local_a4);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar6 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x121,pcVar6);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_a4 = CfdAddTaprootSignByHandle
                                 (handle,create_handle,
                                  (&PTR_anon_var_dwarf_cb792_0078dab8)[(long)local_90.data_ * 0x11],
                                  0,(char *)0x0,
                                  *(char **)(&DAT_0078dad8 + (long)local_90.data_ * 0x88),
                                  *(char **)(&DAT_0078dae0 + (long)local_90.data_ * 0x88),
                                  (char *)0x0);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                       &local_a4);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar6 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x127,pcVar6);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            bVar1 = true;
          }
          else {
LAB_0029d978:
            bVar1 = false;
          }
          if (sighash != (char *)0x0) {
            CfdFreeStringBuffer(sighash);
            sighash = (char *)0x0;
          }
          if (sig != (char *)0x0) {
            CfdFreeStringBuffer(sig);
            sig = (char *)0x0;
          }
          if (tmp_sig != (char *)0x0) {
            CfdFreeStringBuffer(tmp_sig);
            tmp_sig = (char *)0x0;
          }
        }
        if (local_a4 == 0) {
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          local_a4 = CfdFinalizeTransaction(handle,create_handle,(char **)&gtest_ar_);
          local_68.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_a4);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_68);
            pcVar6 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&tmp_ret,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x164,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&tmp_ret,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmp_ret);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_68);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          if (local_a4 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&gtest_ar,"exp_datas[idx].signed_tx","tx_hex",
                       (&PTR_anon_var_dwarf_cb7c6_0078db28)[(long)local_90.data_ * 0x11],
                       (char *)gtest_ar_._0_8_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_68);
              pcVar6 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&tmp_ret,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                         ,0x166,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&tmp_ret,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmp_ret);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_68);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
            if (local_a4 == 0) {
              local_a4 = CfdVerifyTxSignByHandle
                                   (handle,create_handle,
                                    (&PTR_anon_var_dwarf_cb792_0078dab8)
                                    [(long)local_90.data_ * 0x11],0);
              if (bVar1 && local_a4 != 0) {
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                CfdGetLastErrorMessage(handle,(char **)&gtest_ar_);
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,"tapscript_err_msg","err_msg",
                           "The script analysis of tapscript is not supported.",
                           (char *)gtest_ar_._0_8_);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_68);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&tmp_ret,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x172,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&tmp_ret,(Message *)&local_68);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmp_ret);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_68);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                address = gtest_ar_._0_8_;
                iVar3 = strcmp("The script analysis of tapscript is not supported.",
                               (char *)gtest_ar_._0_8_);
                if (iVar3 == 0) {
                  local_a4 = 0;
                }
                CfdFreeStringBuffer((char *)address);
              }
              gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,
                         &local_a4);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar6 = "";
                if (gtest_ar.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x179,pcVar6);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              if (local_a4 != 0) {
                gtest_ar_._0_4_ = 0xffffffff;
                testing::internal::CmpHelperEQ<int,unsigned_long>
                          ((internal *)&gtest_ar,"-1","idx",(int *)&gtest_ar_,
                           (unsigned_long *)&local_90);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  pcVar6 = "";
                  if (gtest_ar.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x17b,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar_);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
              }
            }
          }
        }
      }
      tmp_ret = CfdFreeTransactionHandle(handle,create_handle);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","tmp_ret",(CfdErrorCode *)&gtest_ar_,&tmp_ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar6 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x180,pcVar6);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    local_90.data_ = (AssertHelperData *)((long)&(local_90.data_)->type + 1);
  } while( true );
}

Assistant:

TEST(cfdcapi_transaction, SignTransactionTest) {
  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdSignTransactionTestData {
    int network;
    const char* txid;
    uint32_t vout;
    const char* descriptor;
    int64_t utxo_amount;
    const char* redeem_script;
    const char* tapscript_control;
    const char* tapleaf_hash;
    const char* annex;
    const char* aux_rand;
    const char* pubkey;
    const char* privkey;
    int sighash_type;
    const char* txout_address;
    int64_t amount;
    const char* signed_tx;
    bool use_direct_sign;
    int hash_type;
  };
  const struct CfdSignTransactionTestData exp_datas[] = {
    {  // p2wpkh
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      false, kCfdP2wpkh
    },
    {  // p2wpkh auto sign
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000",
      true, kCfdP2wpkh
    },
    {  // p2wsh-multisig
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wsh(multi(1,023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))",
      2500000000,
      "5121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae",
      nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
      2499999000,
      "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20300473044022050da44f8a8e8ac494b79840c4c7ef7d55a296ffa0b98a5b9d2150964ba6d555802207ae9ec8a4f060440279fa9129ef480132cab1fc638c534ef31af1feda6b5d6f401475121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae00000000",
      false, kCfdP2wsh
    },
    {  // taproot schnorr
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014142ec41bf6c27451b785da1f4e8d50ffa0d9360e3265b55e3b044ed4b96f32d1b13c61987ffd13da2a444d495856a9c97d91b72b61d105921285271bac30ff7c70100000000",
      false, kCfdTaproot
    },
    {  // taproot schnorr auto sign
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014142ec41bf6c27451b785da1f4e8d50ffa0d9360e3265b55e3b044ed4b96f32d1b13c61987ffd13da2a444d495856a9c97d91b72b61d105921285271bac30ff7c70100000000",
      true, kCfdTaproot
    },
    {  // taproot schnorr rand
      kCfdNetworkRegtest,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916", 0,
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      2499999000,
      nullptr, nullptr, nullptr, nullptr,
      "2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916",
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014151df55894d1a024c244e20ecedc39cae39fa6d43653305b7f32605eea6359415a7ceef44c52a2f26be2e06d33d79c2e90b5dfaebcb4f79e242134121e0b9579e0100000000",
      false, kCfdTaproot
    },
    {  // tapscript
      kCfdNetworkRegtest,
      "195d6c18afaa6c33dcc2da86c6c0cd3f93ec2b44e4c8e9be00c7000eafa1805b", 0,
      "raw(51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2)",
      2499999000,
      "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
      "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
      nullptr, nullptr,
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
      kCfdSigHashAll,
      "bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
      2499998000,
      "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5034146f705415495d40c409565862c6da85f4a74318f9d5733b073318059500cf5705ef4ecdc3da1f71d9a687a974433e030395e7876271bf2d80d7880006ede7fd70122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000",
      false, kCfdTaproot
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdSignTransactionTestData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    void* create_handle = nullptr;
    char* sighash = nullptr;
    char* sig = nullptr;
    char* tmp_sig = nullptr;
    ret = CfdInitializeTransaction(
        handle, exp_datas[idx].network, 2, 0, nullptr, &create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((NULL == create_handle));
    if (ret == kCfdSuccess) {
      ret = CfdSetTransactionUtxoData(handle, create_handle,
          exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].utxo_amount,
          nullptr, exp_datas[idx].descriptor, nullptr, nullptr, nullptr, true);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTransactionOutput(handle, create_handle,
          exp_datas[idx].amount, exp_datas[idx].txout_address, nullptr, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);

      bool has_tapscript = false;
      if (ret != kCfdSuccess) {
        // do nothing
      } else if (exp_datas[idx].use_direct_sign) {
        ret = CfdAddSignWithPrivkeyByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].privkey,
            exp_datas[idx].sighash_type, false, true, exp_datas[idx].aux_rand,
            exp_datas[idx].annex);
        EXPECT_EQ(kCfdSuccess, ret);
      } else {
        uint32_t code_separator_pos = cfd::core::kDefaultCodeSeparatorPosition;
        ret = CfdCreateSighashByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].sighash_type, false,
            (exp_datas[idx].redeem_script) ? nullptr : exp_datas[idx].pubkey,
            exp_datas[idx].redeem_script,
            exp_datas[idx].tapleaf_hash, code_separator_pos,
            exp_datas[idx].annex, &sighash);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          // do nothing
        } else if (strlen(exp_datas[idx].pubkey) == 64) {
          // taproot/tapscript
          ret = CfdSignSchnorr(handle, sighash,
              exp_datas[idx].privkey, exp_datas[idx].aux_rand, &tmp_sig);
          EXPECT_EQ(kCfdSuccess, ret);
          ret = CfdAddSighashTypeInSchnorrSignature(handle, tmp_sig,
              exp_datas[idx].sighash_type, false, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          if (exp_datas[idx].redeem_script != nullptr) {
            has_tapscript = true;
            ret = CfdAddTxSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                exp_datas[idx].hash_type, sig, false,
                exp_datas[idx].sighash_type, false, true);
            EXPECT_EQ(kCfdSuccess, ret);

            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                nullptr, exp_datas[idx].redeem_script,
                exp_datas[idx].tapscript_control, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          } else {
            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                sig, nullptr, nullptr, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          }
        } else if (exp_datas[idx].redeem_script != nullptr) {
          // script
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          // multisig first
          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, "", false,
              exp_datas[idx].sighash_type, false, true);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, sig, true,
              exp_datas[idx].sighash_type, false, false);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddScriptHashLastSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, exp_datas[idx].redeem_script);
          EXPECT_EQ(kCfdSuccess, ret);
        } else {
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddPubkeyHashSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].hash_type, exp_datas[idx].pubkey,
            sig, true, exp_datas[idx].sighash_type, false);
          EXPECT_EQ(kCfdSuccess, ret);
        }

        if (sighash != nullptr) {
          CfdFreeStringBuffer(sighash);
          sighash = nullptr;
        }
        if (sig != nullptr) {
          CfdFreeStringBuffer(sig);
          sig = nullptr;
        }
        if (tmp_sig != nullptr) {
          CfdFreeStringBuffer(tmp_sig);
          tmp_sig = nullptr;
        }
      }

      if (ret == kCfdSuccess) {
        char* tx_hex = nullptr;
        ret = CfdFinalizeTransaction(handle, create_handle, &tx_hex);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(exp_datas[idx].signed_tx, tx_hex);
          CfdFreeStringBuffer(tx_hex);
        }
      }

      if (ret == kCfdSuccess) {
        ret = CfdVerifyTxSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout);
        if ((ret != kCfdSuccess) && has_tapscript) {
          char* err_msg = NULL;
          CfdGetLastErrorMessage(handle, &err_msg);
          const char* tapscript_err_msg = "The script analysis of tapscript is not supported.";
          EXPECT_STREQ(tapscript_err_msg, err_msg);
          if (strcmp(tapscript_err_msg, err_msg) == 0) {
            ret = kCfdSuccess;
          }
          CfdFreeStringBuffer(err_msg);
          err_msg = NULL;
        }
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          EXPECT_EQ(-1, idx);
        }
      }

      int tmp_ret = CfdFreeTransactionHandle(handle, create_handle);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

#if 0
    ret = CfdGetLastErrorCode(handle);
    if (ret != kCfdSuccess) {
      char* str_buffer = NULL;
      ret = CfdGetLastErrorMessage(handle, &str_buffer);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("", str_buffer);
      CfdFreeStringBuffer(str_buffer);
      str_buffer = NULL;
      break;
    }
#endif
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}